

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void emit_byte(int val,j_compress_ptr cinfo)

{
  long *plVar1;
  undefined1 *puVar2;
  long lVar3;
  int iVar4;
  long *in_RSI;
  undefined1 in_DIL;
  jpeg_destination_mgr *dest;
  
  plVar1 = (long *)in_RSI[5];
  puVar2 = (undefined1 *)*plVar1;
  *plVar1 = (long)(puVar2 + 1);
  *puVar2 = in_DIL;
  lVar3 = plVar1[1];
  plVar1[1] = lVar3 + -1;
  if ((lVar3 + -1 == 0) && (iVar4 = (*(code *)plVar1[3])(in_RSI), iVar4 == 0)) {
    *(undefined4 *)(*in_RSI + 0x28) = 0x18;
    (**(code **)*in_RSI)(in_RSI);
  }
  return;
}

Assistant:

LOCAL(void)
emit_byte(int val, j_compress_ptr cinfo)
/* Write next output byte; we do not support suspension in this module. */
{
  struct jpeg_destination_mgr *dest = cinfo->dest;

  *dest->next_output_byte++ = (JOCTET)val;
  if (--dest->free_in_buffer == 0)
    if (!(*dest->empty_output_buffer) (cinfo))
      ERREXIT(cinfo, JERR_CANT_SUSPEND);
}